

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

uint16_t handleQuantizeEqualExp
                   (uint16_t abssrc,uint16_t tolSig,float errTol,float srcFloat,int doprint)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int in_EDX;
  ushort in_SI;
  ushort in_DI;
  float in_XMM0_Da;
  float fVar4;
  float in_XMM1_Da;
  uint16_t alt1;
  uint16_t alt0;
  float smalldelta;
  float delta;
  int smallbits;
  int bits;
  uint16_t smallest;
  uint16_t alt;
  uint16_t mask3;
  uint16_t extrabit;
  uint16_t srcMaskedVal;
  uint16_t mask2;
  uint16_t mask;
  uint16_t lowermask;
  uint16_t npow2;
  uint16_t local_36;
  float local_34;
  int local_2c;
  ushort local_22;
  
  uVar1 = in_DI & 0x7ff;
  uVar2 = ((ushort)(uVar1 < in_SI) << 0xc | (ushort)((uVar1 < in_SI != 0 ^ 0xffU) & 1) << 10) ^
          0xf000;
  if (in_EDX != 0) {
    printf("  === npow2 == 0x0800\n");
    printf("  srcMV  0x%04X %016b\n",(ulong)uVar1,(ulong)uVar1);
    printf("  mask2  0x%04X %016b\n",0xf000);
    printf("  mask3  0x%04X %016b\n",(ulong)uVar2,(ulong)uVar2);
  }
  local_2c = countSetBits(in_DI);
  if (uVar1 == in_DI) {
    if (in_EDX != 0) {
      printf("  test0  0x%04X %016b\n",(ulong)(in_DI & uVar2),(ulong)(in_DI & uVar2));
      printf("  test1  0x%04X %016b\n",(ulong)(in_DI + 0x800 & 0xf800),
             (ulong)(in_DI + 0x800 & 0xf800));
    }
    uVar2 = in_DI & uVar2;
    iVar3 = countSetBits(uVar2);
    if (iVar3 < local_2c) {
      fVar4 = imath_half_to_float(uVar2);
      fVar4 = in_XMM1_Da - fVar4;
      local_34 = in_XMM0_Da;
      local_22 = in_DI;
      if ((fVar4 < in_XMM0_Da) &&
         (local_34 = fVar4, local_2c = iVar3, local_22 = uVar2, in_EDX != 0)) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar4,(ulong)uVar2);
      }
    }
    else {
      local_34 = in_XMM0_Da;
      local_22 = in_DI;
      if (iVar3 == local_2c) {
        fVar4 = imath_half_to_float(uVar2);
        local_34 = in_XMM0_Da;
        local_22 = in_DI;
        if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
          local_34 = in_XMM1_Da - fVar4;
          local_2c = iVar3;
          local_22 = uVar2;
        }
      }
    }
  }
  else {
    if (in_EDX != 0) {
      printf("  test0  0x%04X %016b\n",(ulong)(in_DI & 0xf000),(ulong)(in_DI & 0xf000));
      printf("  test1  0x%04X %016b\n",(ulong)(in_DI & 0xf800),(ulong)(in_DI & 0xf800));
      printf("  xxxxx  0x%04X %016b\n",(ulong)(in_DI & uVar2),(ulong)(in_DI & uVar2));
      printf("  test2  0x%04X %016b\n",(ulong)(in_DI + 0x800 & 0xf800),
             (ulong)(in_DI + 0x800 & 0xf800));
    }
    local_36 = in_DI & 0xf000;
    uVar1 = in_DI & 0xf800;
    if (local_36 == uVar1) {
      local_36 = in_DI & uVar2;
    }
    iVar3 = countSetBits(local_36);
    local_22 = in_DI;
    if (iVar3 < local_2c) {
      fVar4 = imath_half_to_float(local_36);
      fVar4 = in_XMM1_Da - fVar4;
      local_34 = in_XMM0_Da;
      if (fVar4 < in_XMM0_Da) {
        if (in_EDX != 0) {
          printf("  smltst 0x%04X delta %g\n",(double)fVar4,(ulong)local_36);
        }
        local_22 = local_36;
        local_34 = fVar4;
        local_2c = iVar3;
      }
    }
    else {
      local_34 = in_XMM0_Da;
      if (iVar3 == local_2c) {
        fVar4 = imath_half_to_float(local_36);
        local_34 = in_XMM0_Da;
        if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
          local_22 = local_36;
          local_34 = in_XMM1_Da - fVar4;
          local_2c = iVar3;
        }
      }
    }
    iVar3 = countSetBits(uVar1);
    if (iVar3 < local_2c) {
      fVar4 = imath_half_to_float(uVar1);
      fVar4 = in_XMM1_Da - fVar4;
      if ((fVar4 < in_XMM0_Da) &&
         (local_34 = fVar4, local_2c = iVar3, local_22 = uVar1, in_EDX != 0)) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar4,(ulong)uVar1);
      }
    }
    else if (iVar3 == local_2c) {
      fVar4 = imath_half_to_float(uVar1);
      if (in_XMM1_Da - fVar4 < local_34) {
        local_34 = in_XMM1_Da - fVar4;
        local_2c = iVar3;
        local_22 = uVar1;
      }
    }
  }
  uVar1 = in_DI + 0x800 & 0xf800;
  iVar3 = countSetBits(uVar1);
  if (iVar3 < local_2c) {
    fVar4 = imath_half_to_float(uVar1);
    if ((fVar4 - in_XMM1_Da < in_XMM0_Da) && (local_22 = uVar1, in_EDX != 0)) {
      printf("  lrgtst 0x%04X delta %g\n",(double)(fVar4 - in_XMM1_Da),(ulong)uVar1);
    }
  }
  else if ((iVar3 == local_2c) &&
          (fVar4 = imath_half_to_float(uVar1), fVar4 - in_XMM1_Da < local_34)) {
    local_22 = uVar1;
  }
  return local_22;
}

Assistant:

static uint16_t handleQuantizeEqualExp (
    uint16_t abssrc, uint16_t tolSig, float errTol, float srcFloat, int doprint)
{
    const uint16_t npow2 = 0x0800;
    const uint16_t lowermask = npow2 - 1;
    const uint16_t mask = ~lowermask;
    const uint16_t mask2 = mask ^ npow2;

    const uint16_t srcMaskedVal = abssrc & lowermask;
    const uint16_t extrabit = (tolSig > srcMaskedVal);

    const uint16_t mask3 = mask2 ^ (((npow2 << 1) * (extrabit)) |
                                    ((npow2 >> 1) * (!extrabit)));

    if (doprint)
    {
        printf ("  === npow2 == 0x0800\n");
        printf ("  srcMV  0x%04X %016b\n", srcMaskedVal, srcMaskedVal);
        printf ("  mask2  0x%04X %016b\n", mask2, mask2);
        printf ("  mask3  0x%04X %016b\n", mask3, mask3);
    }

    // not yet clear how to narrow down below 3 values...
    uint16_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    // doing in this order mask2, mask, +npow guarantees sorting of values
    // so can avoid a couple of conditionals in the macros
    if (srcMaskedVal == abssrc)
    {
        if (doprint)
        {
            printf ("  test0  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  test1  0x%04X %016b\n", ((abssrc + npow2) & mask), ((abssrc + npow2) & mask));
        }
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask3);
    }
    else
    {
        if (doprint)
        {
            printf ("  test0  0x%04X %016b\n", (abssrc & mask2), (abssrc & mask2));
            printf ("  test1  0x%04X %016b\n", (abssrc & mask), (abssrc & mask));
            printf ("  xxxxx  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  test2  0x%04X %016b\n", ((abssrc + npow2) & mask), ((abssrc + npow2) & mask));
        }
        uint16_t alt0 = (abssrc & mask2);
        uint16_t alt1 = (abssrc & mask);
        if (alt0 == alt1) alt0 = (abssrc & mask3);

        TEST_QUANT_ALTERNATE_SMALL(alt0);
        TEST_QUANT_ALTERNATE_SMALL(alt1);
    }
    TEST_QUANT_ALTERNATE_LARGE((abssrc + npow2) & mask);

    return smallest;
}